

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

TopKLayerParams * __thiscall
CoreML::Specification::TopKLayerParams::New(TopKLayerParams *this,Arena *arena)

{
  TopKLayerParams *this_00;
  
  this_00 = (TopKLayerParams *)operator_new(0x28);
  TopKLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::TopKLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

TopKLayerParams* TopKLayerParams::New(::google::protobuf::Arena* arena) const {
  TopKLayerParams* n = new TopKLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}